

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O2

bool __thiscall VL53L0X::setMeasurementTimingBudget(VL53L0X *this,uint32_t budgetMicroseconds)

{
  uint uVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  VL53L0XSequenceStepEnables enables;
  VL53L0XSequenceStepTimeouts timeouts;
  
  if (budgetMicroseconds < 20000) {
    bVar6 = false;
  }
  else {
    getSequenceStepEnables(this,&enables);
    getSequenceStepTimeouts(this,&enables,&timeouts);
    iVar3 = 0x8e8;
    if (enables.tcc != false) {
      iVar3 = timeouts.msrcDssTccMicroseconds + 0xb36;
    }
    if (enables.dss == true) {
      iVar3 = iVar3 + timeouts.msrcDssTccMicroseconds * 2 + 0x564;
    }
    else if (enables.msrc == true) {
      iVar3 = iVar3 + timeouts.msrcDssTccMicroseconds + 0x294;
    }
    iVar5 = 0;
    if (enables.preRange != false) {
      iVar5 = timeouts.preRangeMicroseconds + 0x294;
    }
    uVar1 = iVar5 + iVar3 + 0x226;
    if (enables.finalRange == false) {
      uVar1 = iVar5 + iVar3;
    }
    bVar6 = uVar1 <= budgetMicroseconds;
    if (bVar6) {
      uVar4 = (uint)(byte)timeouts.finalRangeVCSELPeriodPCLKs * 0x3a2f00 + 500;
      uVar2 = 0;
      if (enables.preRange != false) {
        uVar2 = timeouts.preRangeMCLKs;
      }
      uVar2 = encodeTimeout(uVar2 + (short)((ulong)(uVar4 / 2000 +
                                                   (budgetMicroseconds - uVar1) * 1000) /
                                           ((ulong)uVar4 / 1000)));
      writeRegister16Bit(this,'q',uVar2);
      *(uint32_t *)&(this->super_VL53LXX).field_0x6c = budgetMicroseconds;
    }
  }
  return bVar6;
}

Assistant:

bool VL53L0X::setMeasurementTimingBudget(uint32_t budgetMicroseconds) {
	// note that these are different than values in get_
	uint16_t const START_OVERHEAD = 1320;
	uint16_t const END_OVERHEAD = 960;
	uint16_t const MSRC_OVERHEAD = 660;
	uint16_t const TCC_OVERHEAD = 590;
	uint16_t const DSS_OVERHEAD = 690;
	uint16_t const PRE_RANGE_OVERHEAD = 660;
	uint16_t const FINAL_RANGE_OVERHEAD = 550;
	uint32_t const MIN_TIMING_BUDGET = 20000;

	if (budgetMicroseconds < MIN_TIMING_BUDGET) {
		return false;
	}

	VL53L0XSequenceStepEnables enables;
	VL53L0XSequenceStepTimeouts timeouts;
	this->getSequenceStepEnables(&enables);
	this->getSequenceStepTimeouts(&enables, &timeouts);

	uint32_t usedBudgetMicroseconds = START_OVERHEAD + END_OVERHEAD;
	if (enables.tcc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + TCC_OVERHEAD);
	}
	if (enables.dss) {
		usedBudgetMicroseconds += 2 * (timeouts.msrcDssTccMicroseconds + DSS_OVERHEAD);
	} else if (enables.msrc) {
		usedBudgetMicroseconds += (timeouts.msrcDssTccMicroseconds + MSRC_OVERHEAD);
	}
	if (enables.preRange) {
		usedBudgetMicroseconds += (timeouts.preRangeMicroseconds + PRE_RANGE_OVERHEAD);
	}
	if (enables.finalRange) {
		usedBudgetMicroseconds += FINAL_RANGE_OVERHEAD;
	}

	// "Note that the final range timeout is determined by the timing
	// budget and the sum of all other timeouts within the sequence.
	// If there is no room for the final range timeout, then an error
	// will be set. Otherwise the remaining time will be applied to
	// the final range."

	if (usedBudgetMicroseconds > budgetMicroseconds) {
		// "Requested timeout too small."
		return false;
	}

	uint32_t finalRangeTimeoutMicroseconds = budgetMicroseconds - usedBudgetMicroseconds;

	// set_sequence_step_timeout() begin
	// (SequenceStepId == VL53L0X_SEQUENCESTEP_FINAL_RANGE)

	// "For the final range timeout, the pre-range timeout
	// must be added. To do this both final and pre-range
	// timeouts must be expressed in macro periods MClks
	// because they have different vcsel periods."

	uint16_t finalRangeTimeoutMCLKs = timeoutMicrosecondsToMclks(finalRangeTimeoutMicroseconds, timeouts.finalRangeVCSELPeriodPCLKs);

	if (enables.preRange) {
		finalRangeTimeoutMCLKs += timeouts.preRangeMCLKs;
	}

	this->writeRegister16Bit(FINAL_RANGE_CONFIG_TIMEOUT_MACROP_HI, encodeTimeout(finalRangeTimeoutMCLKs));

	// set_sequence_step_timeout() end

	// store for internal reuse
	this->measurementTimingBudgetMicroseconds = budgetMicroseconds;

	return true;
}